

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Function::~Function(Function *this)

{
  Function *this_local;
  
  anon_unknown_18::deleteVectorElements<rsg::Variable>(&this->m_parameters);
  BlockStatement::~BlockStatement(&this->m_functionBlock);
  VariableType::~VariableType(&this->m_returnType);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~vector(&this->m_parameters);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Function::~Function (void)
{
	deleteVectorElements(m_parameters);
}